

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

OpenCLKernel * __thiscall
ocl::KernelSource::getKernel(KernelSource *this,shared_ptr<ocl::OpenCLEngine> *cl,bool printLog)

{
  undefined8 *puVar1;
  __suseconds_t *p_Var2;
  OpenCLEngine *this_00;
  element_type *peVar3;
  element_type *peVar4;
  pointer pcVar5;
  cl_platform_id platform;
  cl_device_id device_00;
  double dVar6;
  cl_int cVar7;
  int iVar8;
  OpenCLKernel *pOVar9;
  cl_program p_Var10;
  VersionedBinary *pVVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  const_iterator cVar14;
  long *plVar15;
  ostream *poVar16;
  pointer puVar17;
  undefined8 *puVar18;
  mapped_type *pp_Var19;
  mapped_type *ppOVar20;
  ocl_exception *this_01;
  ulong *puVar21;
  undefined7 in_register_00000011;
  uint uVar22;
  ulong uVar23;
  size_t __n;
  undefined8 uVar24;
  _Alloc_hider _Var25;
  undefined1 auVar26 [8];
  cl_int ciErrNum;
  cl_device_id device;
  timer tm;
  cl_int binary_status_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> loaded_from_file_binaries;
  cl_int binary_status;
  Lock lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string options;
  string binaries_to_load_filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries_1;
  ifstream program_binaries_file;
  cl_int local_550;
  uint local_54c;
  undefined1 local_548 [16];
  unsigned_long *puStack_538;
  timer local_528;
  cl_program local_4f0;
  undefined8 *local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4c8;
  _cl_device_id *local_4a8;
  long local_4a0;
  _cl_device_id local_498 [16];
  Mutex *local_488;
  char local_480;
  undefined8 *local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_438;
  ulong *local_418;
  long local_410;
  ulong local_408 [2];
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8;
  long lStack_3e0;
  ulong *local_3d8;
  long local_3d0;
  ulong local_3c8;
  long lStack_3c0;
  char *local_3b8 [2];
  char local_3a8 [16];
  shared_ptr<ocl::OpenCLEngine> *local_398;
  string local_390;
  string local_370;
  string local_350;
  undefined1 *local_330;
  long local_328;
  undefined1 local_320 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_310;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  undefined1 local_238 [8];
  pointer ppcStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [13];
  char acStack_150 [16];
  ios_base local_140 [272];
  
  this_00 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pOVar9 = OpenCLEngine::findKernel(this_00,this->id_);
  if (pOVar9 != (OpenCLKernel *)0x0) {
    return pOVar9;
  }
  p_Var10 = OpenCLEngine::findProgram
                      (this_00,((this->program_).
                                super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->id_);
  if (p_Var10 != (cl_program)0x0) goto LAB_001206f0;
  local_54c = (uint)CONCAT71(in_register_00000011,printLog);
  local_488 = (Mutex *)cached_kernels_mutex;
  local_480 = 0;
  Mutex::lock((Mutex *)cached_kernels_mutex);
  local_480 = '\x01';
  pVVar11 = ProgramBinaries::getBinary
                      ((this->program_).
                       super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       cl);
  peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar12 = getCachedBinary(((this->program_).
                             super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_,peVar3->platform_id_,peVar3->device_id_);
  local_550 = 0;
  peVar4 = (this->program_).super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_3b8[0] = local_3a8;
  pcVar5 = (peVar4->defines_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,pcVar5,pcVar5 + (peVar4->defines_)._M_string_length);
  local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"");
  if (local_328 != 0) {
    std::ifstream::ifstream(local_238);
    std::ifstream::open((string *)local_238,(_Ios_Openmode)&local_330);
    p_Var2 = &local_528.start_.tv_usec;
    local_528.counter_ = (double)p_Var2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_528,
               *(undefined8 *)(acStack_150 + (long)*(pointer)((long)local_238 + -0x18)),0xffffffff,0
               ,0xffffffff);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_548,
               local_528.start_.tv_sec,(allocator_type *)&local_4a8);
    puVar17 = local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_548._0_8_;
    local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_548._8_8_;
    local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)puStack_538;
    local_548._0_8_ = (cl_device_id)0x0;
    local_548._8_8_ = (unsigned_long *)0x0;
    puStack_538 = (unsigned_long *)0x0;
    if ((cl_device_id)puVar17 != (cl_device_id)0x0) {
      operator_delete(puVar17);
    }
    if ((cl_device_id)local_548._0_8_ != (cl_device_id)0x0) {
      operator_delete((void *)local_548._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528.start_.tv_sec !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      do {
        *(_cl_device_id *)
         (local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + (long)paVar13) =
             *(_cl_device_id *)((long)local_528.counter_ + (long)paVar13);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar13->_M_local_buf + 1);
      } while (paVar13 < (ulong)local_528.start_.tv_sec);
    }
    std::ifstream::close();
    if ((__suseconds_t *)local_528.counter_ != p_Var2) {
      operator_delete((void *)local_528.counter_);
    }
    std::ifstream::~ifstream(local_238);
    pvVar12 = &local_4c8;
  }
  if (pvVar12 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    if (pVVar11->device_address_bits_ == 0) {
      local_238 = (undefined1  [8])0x0;
      ppcStack_230 = (pointer)0x0;
      local_228[0]._M_allocated_capacity = (pointer)0x0;
      local_528.start_.tv_usec = 0;
      local_528.counter_ = 0.0;
      local_528.start_.tv_sec = 0;
      local_548._0_8_ = pVVar11->data_;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_238,
                 (value_type *)local_548);
      local_548._0_8_ = pVVar11->size_;
      if (local_528.start_.tv_sec == local_528.start_.tv_usec) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_528,
                   (iterator)local_528.start_.tv_sec,(unsigned_long *)local_548);
      }
      else {
        *(undefined8 *)local_528.start_.tv_sec = local_548._0_8_;
        local_528.start_.tv_sec = local_528.start_.tv_sec + 8;
      }
      p_Var10 = clCreateProgramWithSource
                          (((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->context_,
                           (cl_uint)((ulong)((long)ppcStack_230 - (long)local_238) >> 3),
                           (char **)local_238,(size_t *)local_528.counter_,&local_550);
      cVar7 = local_550;
      paVar13 = &local_298.field_2;
      local_298._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
      reportError(cVar7,0x22c,&local_298);
      _Var25._M_p = local_298._M_dataplus._M_p;
      goto LAB_0011fad6;
    }
    local_528.counter_ = 0.0;
    local_528.start_.tv_sec = 0;
    local_528.start_.tv_usec = 0;
    puStack_538 = (unsigned_long *)0x0;
    local_548._0_8_ = (cl_device_id)0x0;
    local_548._8_8_ = (unsigned_long *)0x0;
    local_238 = (undefined1  [8])pVVar11->data_;
    std::vector<unsigned_char_const*,std::allocator<unsigned_char_const*>>::
    _M_realloc_insert<unsigned_char_const*>
              ((vector<unsigned_char_const*,std::allocator<unsigned_char_const*>> *)&local_528,
               (iterator)0x0,(uchar **)local_238);
    local_238 = (undefined1  [8])pVVar11->size_;
    if ((unsigned_long *)local_548._8_8_ == puStack_538) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_548,
                 (iterator)local_548._8_8_,(unsigned_long *)local_238);
    }
    else {
      *(undefined1 (*) [8])local_548._8_8_ = local_238;
      local_548._8_8_ = local_548._8_8_ + 8;
    }
    peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_4a8 = peVar3->device_id_;
    p_Var10 = clCreateProgramWithBinary
                        (peVar3->context_,1,&local_4a8,(size_t *)local_548._0_8_,
                         (uchar **)local_528.counter_,(cl_int *)&local_4e8,&local_550);
    cVar7 = (cl_int)local_4e8;
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
    reportError(cVar7,0x238,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    cVar7 = local_550;
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
    reportError(cVar7,0x239,&local_2d8);
    local_4f0 = p_Var10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_238 = (undefined1  [8])local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"cl_khr_spir","");
    cVar14 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&(peVar3->device_info_).extensions._M_t,(key_type *)local_238);
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238);
    }
    if (cVar14._M_node ==
        &(peVar3->device_info_).extensions._M_t._M_impl.super__Rb_tree_header._M_header) {
      this_01 = (ocl_exception *)__cxa_allocate_exception(0x10);
      ocl_exception::ocl_exception(this_01,"Device does not support SPIR!");
      __cxa_throw(this_01,&ocl_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::append((char *)local_3b8);
    p_Var10 = local_4f0;
    auVar26 = (undefined1  [8])local_528.counter_;
    if ((cl_device_id)local_548._0_8_ != (cl_device_id)0x0) {
      operator_delete((void *)local_548._0_8_);
      auVar26 = (undefined1  [8])local_528.counter_;
    }
  }
  else {
    local_238 = (undefined1  [8])0x0;
    ppcStack_230 = (pointer)0x0;
    local_228[0]._M_allocated_capacity = (pointer)0x0;
    local_528.start_.tv_usec = 0;
    local_528.counter_ = 0.0;
    local_528.start_.tv_sec = 0;
    local_548._0_8_ =
         (pvVar12->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    std::vector<unsigned_char_const*,std::allocator<unsigned_char_const*>>::
    _M_realloc_insert<unsigned_char_const*>
              ((vector<unsigned_char_const*,std::allocator<unsigned_char_const*>> *)local_238,
               (iterator)0x0,(uchar **)local_548);
    local_548._0_8_ =
         (pvVar12->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)(pvVar12->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start;
    if (local_528.start_.tv_sec == local_528.start_.tv_usec) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_528,
                 (iterator)local_528.start_.tv_sec,(unsigned_long *)local_548);
    }
    else {
      *(undefined8 *)local_528.start_.tv_sec = local_548._0_8_;
      local_528.start_.tv_sec = local_528.start_.tv_sec + 8;
    }
    peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_548._0_8_ = peVar3->device_id_;
    p_Var10 = clCreateProgramWithBinary
                        (peVar3->context_,1,(cl_device_id *)local_548,(size_t *)local_528.counter_,
                         (uchar **)local_238,(cl_int *)&local_4a8,&local_550);
    cVar7 = (cl_int)local_4a8;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
    reportError(cVar7,0x222,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    cVar7 = local_550;
    paVar13 = &local_278.field_2;
    local_278._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
    reportError(cVar7,0x223,&local_278);
    _Var25._M_p = local_278._M_dataplus._M_p;
LAB_0011fad6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var25._M_p != paVar13) {
      operator_delete(_Var25._M_p);
    }
    auVar26 = local_238;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528.counter_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_528.counter_);
      auVar26 = local_238;
    }
  }
  if (auVar26 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar26);
  }
  to_string<unsigned_long>
            ((string *)&local_528,
             ((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             wavefront_size_);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_528,0,(char *)0x0,0x13061d);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 == paVar13) {
    local_228[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_228[0]._8_8_ = plVar15[3];
    local_238 = (undefined1  [8])local_228;
  }
  else {
    local_228[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_238 = (undefined1  [8])*plVar15;
  }
  ppcStack_230 = (pointer)plVar15[1];
  *plVar15 = (long)paVar13;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_3b8,(ulong)local_238);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238);
  }
  if ((__suseconds_t *)local_528.counter_ != &local_528.start_.tv_usec) {
    operator_delete((void *)local_528.counter_);
  }
  timer::timer(&local_528,false);
  if (local_528.is_running_ == 0) {
    gettimeofday((timeval *)local_238,(__timezone_ptr_t)0x0);
    local_528.start_.tv_sec = (__time_t)local_238;
    local_528.start_.tv_usec = (__suseconds_t)ppcStack_230;
    local_528.is_running_ = 1;
  }
  local_54c = local_54c ^ 1;
  if ((pvVar12 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0 &&
       (char)local_54c == '\0') &&
     (iVar8 = std::__cxx11::string::compare
                        ((char *)&((this->program_).
                                   super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->program_name_), iVar8 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Building kernels for ",0x15);
    peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(peVar3->device_info_).device_name._M_dataplus._M_p,
                         (peVar3->device_info_).device_name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"... ",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  local_550 = clBuildProgram(p_Var10,0,(cl_device_id *)0x0,local_3b8[0],
                             (_func_void_cl_program_void_ptr *)0x0,(void *)0x0);
  uVar22 = local_54c;
  if ((pvVar12 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) && (local_550 == 0))
  {
    iVar8 = std::__cxx11::string::compare
                      ((char *)&((this->program_).
                                 super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->program_name_);
    if (iVar8 == 0 && (char)uVar22 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Kernels compilation done in ",0x1c);
      dVar6 = timer::elapsed(&local_528);
      poVar16 = std::ostream::_M_insert<double>(dVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," seconds",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
    }
    local_4f0 = p_Var10;
    getProgramBinaries((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,p_Var10);
    iVar8 = ((this->program_).super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->id_;
    peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    platform = peVar3->platform_id_;
    device_00 = peVar3->device_id_;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar23 = (long)ppcStack_230 - (long)local_238;
    local_398 = cl;
    if (uVar23 == 0) {
      puVar17 = (pointer)0x0;
    }
    else {
      if ((long)uVar23 < 0) {
        std::__throw_bad_alloc();
      }
      puVar17 = (pointer)operator_new(uVar23);
    }
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar17 + uVar23;
    __n = (long)ppcStack_230 - (long)local_238;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar17;
    if (__n != 0) {
      local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar17;
      memmove(puVar17,(void *)local_238,__n);
    }
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar17 + __n;
    setCachedBinary(iVar8,platform,device_00,&local_438);
    cl = local_398;
    uVar22 = local_54c;
    if (local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    p_Var10 = local_4f0;
    if (local_238 != (undefined1  [8])0x0) {
      operator_delete((void *)local_238);
    }
  }
  if ((local_550 == 0 & (byte)uVar22) == 0) {
    oclPrintBuildLog(p_Var10);
    local_548._0_8_ = &puStack_538;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"");
    if ((unsigned_long *)local_548._8_8_ != (unsigned_long *)0x0) {
      getProgramBinaries(&local_310,p_Var10);
      local_4a8 = local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4a8,
                 local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      std::ofstream::ofstream(local_238);
      local_418 = local_408;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_418,local_548._0_8_,
                 (cl_device_id)(local_548._8_8_ + local_548._0_8_));
      std::__cxx11::string::append((char *)&local_418);
      to_string<_cl_platform_id*>
                (&local_350,
                 ((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 platform_id_);
      uVar23 = 0xf;
      if (local_418 != local_408) {
        uVar23 = local_408[0];
      }
      if (uVar23 < local_350._M_string_length + local_410) {
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          uVar24 = local_350.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_350._M_string_length + local_410) goto LAB_0012018a;
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_418);
      }
      else {
LAB_0012018a:
        puVar18 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_418,(ulong)local_350._M_dataplus._M_p);
      }
      local_478 = &local_468;
      puVar1 = puVar18 + 2;
      if ((undefined8 *)*puVar18 == puVar1) {
        local_468 = *puVar1;
        uStack_460 = puVar18[3];
      }
      else {
        local_468 = *puVar1;
        local_478 = (undefined8 *)*puVar18;
      }
      local_470 = puVar18[1];
      *puVar18 = puVar1;
      puVar18[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_478);
      puVar21 = (ulong *)(plVar15 + 2);
      if ((ulong *)*plVar15 == puVar21) {
        local_3e8 = *puVar21;
        lStack_3e0 = plVar15[3];
        local_3f8 = &local_3e8;
      }
      else {
        local_3e8 = *puVar21;
        local_3f8 = (ulong *)*plVar15;
      }
      local_3f0 = plVar15[1];
      *plVar15 = (long)puVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      to_string<_cl_device_id*>
                (&local_370,
                 ((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 device_id_);
      uVar23 = 0xf;
      if (local_3f8 != &local_3e8) {
        uVar23 = local_3e8;
      }
      if (uVar23 < local_370._M_string_length + local_3f0) {
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          uVar24 = local_370.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_370._M_string_length + local_3f0) goto LAB_001202d6;
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,(ulong)local_3f8);
      }
      else {
LAB_001202d6:
        puVar18 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3f8,(ulong)local_370._M_dataplus._M_p);
      }
      local_458 = &local_448;
      puVar1 = puVar18 + 2;
      if ((undefined8 *)*puVar18 == puVar1) {
        local_448 = *puVar1;
        uStack_440 = puVar18[3];
      }
      else {
        local_448 = *puVar1;
        local_458 = (undefined8 *)*puVar18;
      }
      local_450 = puVar18[1];
      *puVar18 = puVar1;
      puVar18[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_458);
      puVar21 = (ulong *)(plVar15 + 2);
      if ((ulong *)*plVar15 == puVar21) {
        local_3c8 = *puVar21;
        lStack_3c0 = plVar15[3];
        local_3d8 = &local_3c8;
      }
      else {
        local_3c8 = *puVar21;
        local_3d8 = (ulong *)*plVar15;
      }
      local_3d0 = plVar15[1];
      *plVar15 = (long)puVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      to_string<int>(&local_390,
                     ((this->program_).
                      super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     id_);
      uVar23 = 0xf;
      if (local_3d8 != &local_3c8) {
        uVar23 = local_3c8;
      }
      if (uVar23 < local_390._M_string_length + local_3d0) {
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          uVar24 = local_390.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_390._M_string_length + local_3d0) goto LAB_0012041b;
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,(ulong)local_3d8);
      }
      else {
LAB_0012041b:
        puVar18 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3d8,(ulong)local_390._M_dataplus._M_p);
      }
      local_4e8 = &local_4d8;
      puVar1 = puVar18 + 2;
      if ((undefined8 *)*puVar18 == puVar1) {
        local_4d8 = *puVar1;
        uStack_4d0 = puVar18[3];
      }
      else {
        local_4d8 = *puVar1;
        local_4e8 = (undefined8 *)*puVar18;
      }
      local_4e0 = puVar18[1];
      *puVar18 = puVar1;
      puVar18[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::ofstream::open((string *)local_238,(_Ios_Openmode)&local_4e8);
      if (local_4e8 != &local_4d8) {
        operator_delete(local_4e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p);
      }
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8);
      }
      if (local_458 != &local_448) {
        operator_delete(local_458);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8);
      }
      if (local_478 != &local_468) {
        operator_delete(local_478);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p);
      }
      if (local_418 != local_408) {
        operator_delete(local_418);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,(char *)local_4a8,local_4a0);
      std::ofstream::close();
      local_238 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_238 + (&_VTT->_M_allocated_capacity)[-3]) =
           ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&ppcStack_230);
      std::ios_base::~ios_base(local_140);
      if (local_4a8 != local_498) {
        operator_delete(local_4a8);
      }
      if (local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((cl_device_id)local_548._0_8_ != (cl_device_id)&puStack_538) {
      operator_delete((void *)local_548._0_8_);
    }
  }
  if (local_550 != 0) {
    clReleaseProgram(p_Var10);
    p_Var10 = (mapped_type)0x0;
  }
  cVar7 = local_550;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
  reportError(cVar7,0x272,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  local_238._0_4_ =
       ((this->program_).super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->id_;
  pp_Var19 = std::
             map<int,__cl_program_*,_std::less<int>,_std::allocator<std::pair<const_int,__cl_program_*>_>_>
             ::operator[](&((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->programs_,(key_type *)local_238);
  *pp_Var19 = p_Var10;
  if (local_528.laps_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_528.laps_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_330 != local_320) {
    operator_delete(local_330);
  }
  if ((cl_device_id)
      local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (cl_device_id)0x0) {
    operator_delete(local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0]);
  }
  if (local_480 == '\x01') {
    Mutex::unlock(local_488);
  }
LAB_001206f0:
  pOVar9 = (OpenCLKernel *)operator_new(0x30);
  (pOVar9->kernel_name_)._M_dataplus._M_p = (pointer)&(pOVar9->kernel_name_).field_2;
  (pOVar9->kernel_name_)._M_string_length = 0;
  (pOVar9->kernel_name_).field_2._M_local_buf[0] = '\0';
  pOVar9->kernel_ = (cl_kernel)0x0;
  pOVar9->work_group_size_ = 0;
  OpenCLKernel::create(pOVar9,p_Var10,(this->name_)._M_dataplus._M_p,(cl_device_id)0x0);
  ppOVar20 = std::
             map<int,_ocl::OpenCLKernel_*,_std::less<int>,_std::allocator<std::pair<const_int,_ocl::OpenCLKernel_*>_>_>
             ::operator[](&((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->kernels_,&this->id_);
  *ppOVar20 = pOVar9;
  return pOVar9;
}

Assistant:

OpenCLKernel *KernelSource::getKernel(const std::shared_ptr<OpenCLEngine> &cl, bool printLog)
{
	OpenCLKernel *kernel = cl->findKernel(id_);
	if (kernel)
		return kernel;

	cl_program program = cl->findProgram(program_->id());

	if (!program) {
		Lock lock(cached_kernels_mutex);

		bool verbose = printLog || OCL_VERBOSE_COMPILE_LOG;

		const VersionedBinary* binary = program_->getBinary(cl);
		const std::vector<unsigned char>* cachedCompiledBinary = getCachedBinary(program_->id(), cl->platform(), cl->device());

		cl_int ciErrNum = CL_SUCCESS;

		std::string options = program_->defines();

		std::vector<unsigned char> loaded_from_file_binaries;
		std::string binaries_to_load_filename = LOAD_KERNEL_BINARIES_FROM_FILE;

		if (!binaries_to_load_filename.empty()){
			std::ifstream program_binaries_file;
			program_binaries_file.open(binaries_to_load_filename);

			std::string binaries_string((std::istreambuf_iterator<char>(program_binaries_file)), std::istreambuf_iterator<char>());

			loaded_from_file_binaries = std::vector<unsigned char>(binaries_string.size());
			for (int i = 0; i < binaries_string.size(); ++i) {
				loaded_from_file_binaries[i] = (unsigned char) binaries_string[i];
			}
			cachedCompiledBinary = &loaded_from_file_binaries;

			program_binaries_file.close();
		}

		if (cachedCompiledBinary != NULL) {
			std::vector<const unsigned char *>	kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back(cachedCompiledBinary->data());
			kernel_sizes.push_back(cachedCompiledBinary->size());

			cl_device_id device = cl->device();
			cl_int binary_status;

			program = clCreateProgramWithBinary(cl->context(), 1, &device, &kernel_sizes[0], &kernel_ptrs[0], &binary_status, &ciErrNum);
			OCL_SAFE_CALL(binary_status);
			OCL_SAFE_CALL(ciErrNum);
		} else if (binary->deviceAddressBits() == 0) {
			std::vector<const char *>			kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back(binary->data());
			kernel_sizes.push_back(binary->size());

			program = clCreateProgramWithSource(cl->context(), kernel_ptrs.size(), &kernel_ptrs[0], &kernel_sizes[0], &ciErrNum);
			OCL_SAFE_CALL(ciErrNum);
		} else {
			std::vector<const unsigned char *>	kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back((unsigned char*) binary->data());
			kernel_sizes.push_back(binary->size());

			cl_device_id device = cl->device();
			cl_int binary_status;

			program = clCreateProgramWithBinary(cl->context(), 1, &device, &kernel_sizes[0], &kernel_ptrs[0], &binary_status, &ciErrNum);
			OCL_SAFE_CALL(binary_status);
			OCL_SAFE_CALL(ciErrNum);

			if (cl->deviceInfo().extensions.count("cl_khr_spir") == 0)
				throw ocl_exception("Device does not support SPIR!");

			options += " -x spir";
		}

		options += " -D WARP_SIZE=" + to_string(cl->wavefrontSize());

		timer tm;
		tm.start();

		if (cachedCompiledBinary == NULL && verbose) {
			if (program_->programName() == "") {
				std::cout << "Building kernels for " << cl->deviceName() << "... " << std::endl;
			}
//			else {
//				std::cout << "Building kernel " << program_->programName() << " for " << cl->deviceName() << "... " << std::endl;
//			}
		}

		ciErrNum = clBuildProgram(program, 0, NULL, options.c_str(), NULL, NULL);

		if (ciErrNum == CL_SUCCESS && cachedCompiledBinary == NULL) {
			if (program_->programName() == "" && verbose) {
				std::cout << "Kernels compilation done in " << tm.elapsed() << " seconds" << std::endl;
			}
//			else {
//				std::cout << "Kernel " << program_->programName() << " compilation done in " << tm.elapsed() << " seconds" << std::endl;
//			}

			std::vector<unsigned char> binaries = getProgramBinaries(program);
			setCachedBinary(program_->id(), cl->platform(), cl->device(), binaries);
		}

		if (ciErrNum != CL_SUCCESS || verbose) {
			ocl::oclPrintBuildLog(program);

			std::string binaries_filename = DUMP_KERNEL_BINARIES_TO_FILE;
			if (!binaries_filename.empty()) {
				std::vector<unsigned char> binaries = getProgramBinaries(program);
				std::string binaries_string((char*) binaries.data(), binaries.size());

				std::ofstream program_binaries_file;
				program_binaries_file.open(binaries_filename + "_platform" + to_string(cl->platform()) + "_device" + to_string(cl->device()) + "_program" + to_string(program_->id()));

				program_binaries_file << binaries_string;
				program_binaries_file.close();
			}
		}

		if (ciErrNum != CL_SUCCESS) {
			clReleaseProgram(program);
			program = 0;
		}

		OCL_SAFE_CALL(ciErrNum);
		cl->programs()[program_->id()] = program;
	}

	kernel = new OpenCLKernel;
	kernel->create(program, name_.c_str());

	cl->kernels()[id_] = kernel;

	return kernel;
}